

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

int ImfHeaderV3iAttribute(ImfHeader *hdr,char *name,int *x,int *y,int *z)

{
  TypedAttribute<Imath_3_2::Vec3<int>_> *pTVar1;
  
  pTVar1 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec3<int>>>
                     ((Header *)hdr,name);
  *x = (pTVar1->_value).x;
  *y = (pTVar1->_value).y;
  *z = (pTVar1->_value).z;
  return 1;
}

Assistant:

int
ImfHeaderV3iAttribute (
    const ImfHeader* hdr, const char name[], int* x, int* y, int* z)
{
    try
    {
        const V3i& v =
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::V3iAttribute> (
                    name)
                .value ();

        *x = v.x;
        *y = v.y;
        *z = v.z;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}